

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diy-fp.h
# Opt level: O0

void __thiscall FIX::double_conversion::DiyFp::Normalize(DiyFp *this)

{
  uint64_t k10MSBits;
  uint64_t uStack_18;
  int exponent;
  uint64_t significand;
  DiyFp *this_local;
  
  if (this->f_ == 0) {
    __assert_fail("f_ != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/diy-fp.h"
                  ,0x4e,"void FIX::double_conversion::DiyFp::Normalize()");
  }
  k10MSBits._4_4_ = this->e_;
  for (uStack_18 = this->f_; (uStack_18 & 0xffc0000000000000) == 0; uStack_18 = uStack_18 << 10) {
    k10MSBits._4_4_ = k10MSBits._4_4_ + -10;
  }
  for (; (uStack_18 & 0x8000000000000000) == 0; uStack_18 = uStack_18 << 1) {
    k10MSBits._4_4_ = k10MSBits._4_4_ + -1;
  }
  this->f_ = uStack_18;
  this->e_ = k10MSBits._4_4_;
  return;
}

Assistant:

void Normalize() {
    ASSERT(f_ != 0);
    uint64_t significand = f_;
    int exponent = e_;

    // This method is mainly called for normalizing boundaries. In general
    // boundaries need to be shifted by 10 bits. We thus optimize for this case.
    const uint64_t k10MSBits = UINT64_2PART_C(0xFFC00000, 00000000);
    while ((significand & k10MSBits) == 0) {
      significand <<= 10;
      exponent -= 10;
    }
    while ((significand & kUint64MSB) == 0) {
      significand <<= 1;
      exponent--;
    }
    f_ = significand;
    e_ = exponent;
  }